

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

void __thiscall ON_V5ExtrusionDisplayMeshCache::DestroyHelper(ON_V5ExtrusionDisplayMeshCache *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  p_Var1 = (this->m_render_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->m_render_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_render_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->m_analysis_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_analysis_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_analysis_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

void ON_V5ExtrusionDisplayMeshCache::DestroyHelper()
{
  m_render_mesh.reset();
  m_analysis_mesh.reset();
}